

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O3

bool libaom_examples::parse_multilayer_file(char *metadata_path,MultilayerMetadata *multilayer)

{
  vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_> *this;
  MultilayerViewType *pMVar1;
  ushort uVar2;
  MultilayerUseCase MVar3;
  pointer pLVar4;
  double dVar5;
  pointer pLVar6;
  DepthRepresentationElement DVar7;
  DepthRepresentationElement DVar8;
  DepthRepresentationElement DVar9;
  DepthRepresentationElement DVar10;
  LayerMetadata *pLVar11;
  char cVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  pointer pLVar22;
  long lVar23;
  pointer pLVar24;
  ulong uVar25;
  ulong uVar26;
  undefined8 uVar27;
  string *psVar28;
  bool *pbVar29;
  char *pcVar30;
  iterator __position;
  libaom_examples *this_00;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  ulong uVar34;
  ulong uVar35;
  byte bVar36;
  byte bVar37;
  undefined8 uVar38;
  int line_idx;
  bool syntax_error_1;
  bool local_394;
  bool syntax_error;
  bool has_list_prefix_1;
  bool has_list_prefix_2;
  ParsedValue value_2;
  DepthRepresentationElement el;
  int indent_1;
  string field_name_1;
  int indent_2;
  bool has_list_prefix;
  AlphaInformation *local_340;
  int indent;
  ParsedValue value_1;
  string field_name_2;
  bool bStack_2e0;
  uint8_t uStack_2df;
  uint8_t uStack_2de;
  bool bStack_2dd;
  string field_name;
  ParsedValue value;
  ifstream file;
  
  bVar37 = 0;
  std::ifstream::ifstream(&file,metadata_path,_S_in);
  cVar12 = std::__basic_file<char>::is_open();
  if (cVar12 != '\0') {
    line_idx = 0;
    indent = -1;
    field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
    field_name._M_string_length = 0;
    field_name.field_2._M_local_buf[0] = '\0';
    value.type_ = kNone;
    value.int_value_ = 0;
    value.double_value_ = 0.0;
    multilayer->use_case = MULTILAYER_USE_CASE_UNSPECIFIED;
    pLVar22 = (multilayer->layers).
              super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (multilayer->layers).
    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (multilayer->layers).
    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (multilayer->layers).
    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (pLVar22 != (pointer)0x0) {
      operator_delete(pLVar22);
    }
    this = &multilayer->layers;
LAB_0012737f:
    do {
      bVar13 = anon_unknown_0::parse_line
                         (&file,0,false,&indent,&has_list_prefix,&line_idx,&field_name,&value,
                          &local_394);
      if (!bVar13) {
        bVar37 = local_394 ^ 1;
        goto LAB_00128147;
      }
      iVar16 = std::__cxx11::string::compare((char *)&field_name);
      if (iVar16 != 0) {
        iVar16 = std::__cxx11::string::compare((char *)&field_name);
        if (iVar16 == 0) {
          iVar16 = indent + 1;
          indent_1 = -1;
          field_name_1._M_string_length = 0;
          field_name_1.field_2._M_local_buf[0] = '\0';
          value_1.type_ = kNone;
          value_1.int_value_ = 0;
          value_1.double_value_ = 0.0;
          bVar13 = false;
          bVar15 = false;
          field_name_1._M_dataplus._M_p = (pointer)&field_name_1.field_2;
LAB_00127433:
          while( true ) {
            pbVar29 = &has_list_prefix_1;
            bVar14 = anon_unknown_0::parse_line
                               (&file,iVar16,true,&indent_1,pbVar29,&line_idx,&field_name_1,&value_1
                                ,&syntax_error);
            if (!bVar14) {
              if (syntax_error == false) {
                pLVar22 = (multilayer->layers).
                          super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                anon_unknown_0::validate_layer
                          ((anon_unknown_0 *)(ulong)pLVar22[-1].layer_type,
                           (LayerMetadata *)(ulong)pLVar22[-1].layer_metadata_scope,bVar13,bVar15);
                bVar13 = true;
              }
              else {
                bVar13 = false;
              }
              goto LAB_001280aa;
            }
            pLVar22 = (multilayer->layers).
                      super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (has_list_prefix_1 == true) {
              pLVar4 = (this->
                       super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (3 < (ulong)(((long)pLVar22 - (long)pLVar4 >> 2) * -0x70a3d70a3d70a3d7)) {
                parse_multilayer_file((libaom_examples *)&line_idx);
                goto LAB_001280a5;
              }
              __position._M_current = pLVar22;
              if (pLVar4 != pLVar22) {
                anon_unknown_0::validate_layer
                          ((anon_unknown_0 *)(ulong)pLVar22[-1].layer_type,
                           (LayerMetadata *)(ulong)pLVar22[-1].layer_metadata_scope,bVar13,bVar15);
                pLVar22 = (multilayer->layers).
                          super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                __position._M_current =
                     (multilayer->layers).
                     super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
              }
              if (((long)__position._M_current - (long)pLVar22 == 100) &&
                 (__position._M_current[-1].layer_color_description.second == true)) {
                parse_multilayer_file();
                goto LAB_001280a5;
              }
              field_name_2._M_dataplus._M_p = field_name_2._M_dataplus._M_p & 0xffffff0000000000;
              field_name_2._M_string_length = field_name_2._M_string_length & 0xffff000000000000;
              field_name_2.field_2._M_local_buf[8] = '\0';
              field_name_2.field_2._M_allocated_capacity = 0;
              field_name_2.field_2._12_4_ = ALPHA_STRAIGHT;
              bStack_2e0 = false;
              uStack_2df = '\0';
              uStack_2de = '\0';
              bStack_2dd = false;
              if (__position._M_current ==
                  (multilayer->layers).
                  super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                ::_M_realloc_insert<libaom_examples::LayerMetadata>
                          (this,__position,(LayerMetadata *)&field_name_2);
                pLVar22 = (multilayer->layers).
                          super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                psVar28 = &field_name_2;
                for (lVar23 = 0x19; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (__position._M_current)->layer_type = *(LayerType *)&(psVar28->_M_dataplus)._M_p;
                  psVar28 = (string *)((long)psVar28 + (ulong)bVar37 * -8 + 4);
                  __position._M_current = __position._M_current + (ulong)bVar37 * -8 + 4;
                }
                pLVar22 = (multilayer->layers).
                          super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1;
                (multilayer->layers).
                super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                ._M_impl.super__Vector_impl_data._M_finish = pLVar22;
              }
              bVar13 = false;
              bVar15 = false;
            }
            if ((this->
                super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                )._M_impl.super__Vector_impl_data._M_start == pLVar22) {
              parse_multilayer_file((libaom_examples *)&line_idx);
              goto LAB_001280a5;
            }
            iVar17 = std::__cxx11::string::compare((char *)&field_name_1);
            if (iVar17 != 0) break;
            uVar25 = (ulong)(uint)line_idx;
            if (value_1.type_ != kInteger) {
LAB_00128035:
              if (value_1.type_ == kFloatingPoint) {
                pcVar30 = "Floating point value found where integer was expected at line %d\n";
              }
              else {
                pcVar30 = "No value found where integer was expected at line %d\n";
              }
              fprintf(_stderr,pcVar30,uVar25);
              goto LAB_001280a5;
            }
            if (0x1f < (ulong)value_1.int_value_) {
              uVar31 = 0x1f;
LAB_001280df:
              fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n",
                      value_1.int_value_,0,uVar31);
              goto LAB_001280a5;
            }
            pLVar22[-1].layer_type = (LayerType)value_1.int_value_;
          }
          iVar18 = std::__cxx11::string::compare((char *)&field_name_1);
          iVar17 = (int)pLVar22;
          if (iVar18 == 0) {
            bVar14 = anon_unknown_0::ParsedValue::IntegerValueInRange<bool>
                               ((ParsedValue *)(ulong)value_1.type_,value_1.int_value_,
                                (ulong)(uint)line_idx,iVar17 + -0x60,pbVar29);
          }
          else {
            iVar18 = std::__cxx11::string::compare((char *)&field_name_1);
            if (iVar18 == 0) {
              uVar25 = (ulong)(uint)line_idx;
              if (value_1.type_ != kInteger) goto LAB_00128035;
              if (7 < (ulong)value_1.int_value_) {
                uVar31 = 7;
                goto LAB_001280df;
              }
              pLVar22[-1].layer_view_type = (MultilayerViewType)value_1.int_value_;
              goto LAB_00127433;
            }
            iVar18 = std::__cxx11::string::compare((char *)&field_name_1);
            if (iVar18 == 0) {
              iVar17 = 3;
            }
            else {
              iVar18 = std::__cxx11::string::compare((char *)&field_name_1);
              if (iVar18 != 0) {
                iVar18 = std::__cxx11::string::compare((char *)&field_name_1);
                if (iVar18 == 0) {
                  uVar25 = (ulong)(uint)line_idx;
                  if (value_1.type_ != kInteger) goto LAB_00128035;
                  if (3 < (ulong)value_1.int_value_) {
                    uVar31 = 3;
                    goto LAB_001280df;
                  }
                  pLVar22[-1].layer_metadata_scope = (MultilayerMetadataScope)value_1.int_value_;
                }
                else {
                  iVar18 = std::__cxx11::string::compare((char *)&field_name_1);
                  if (iVar18 != 0) {
                    iVar18 = std::__cxx11::string::compare((char *)&field_name_1);
                    if (iVar18 == 0) {
                      iVar18 = indent_1 + 1;
                      local_340 = &pLVar22[-1].global_alpha_info;
                      el.sign_flag = true;
                      el.exponent = 0xff;
                      el.mantissa_len = 0xff;
                      el._3_1_ = 0xff;
                      field_name_2._M_dataplus._M_p = (pointer)&field_name_2.field_2;
                      field_name_2._M_string_length = 0;
                      field_name_2.field_2._M_allocated_capacity =
                           field_name_2.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      value_2.type_ = kNone;
                      value_2.int_value_ = 0;
                      value_2.double_value_ = 0.0;
                      pLVar22[-1].global_alpha_info.alpha_color_description.second = false;
                      pLVar22[-1].global_alpha_info.alpha_use_idc = ALPHA_STRAIGHT;
                      pLVar22[-1].global_alpha_info.alpha_simple_flag = false;
                      pLVar22[-1].global_alpha_info.alpha_bit_depth = '\0';
                      pLVar22[-1].global_alpha_info.alpha_clip_idc = '\0';
                      pLVar22[-1].global_alpha_info.alpha_incr_flag = false;
                      pLVar11 = pLVar22 + -1;
                      pLVar22[-1].global_alpha_info.alpha_transparent_value = 0;
                      pLVar22[-1].global_alpha_info.alpha_opaque_value = 0;
                      (pLVar11->global_alpha_info).alpha_color_description.first.color_range = false
                      ;
                      (pLVar11->global_alpha_info).alpha_color_description.first.color_primaries =
                           '\0';
                      (pLVar11->global_alpha_info).alpha_color_description.first.
                      transfer_characteristics = '\0';
                      (pLVar11->global_alpha_info).alpha_color_description.first.matrix_coefficients
                           = '\0';
LAB_00127b5d:
                      do {
                        pbVar29 = &has_list_prefix_2;
                        bVar13 = anon_unknown_0::parse_line
                                           (&file,iVar18,false,(int *)&el,pbVar29,&line_idx,
                                            &field_name_2,&value_2,&syntax_error_1);
                        if (!bVar13) {
                          if (syntax_error_1 == false) {
                            bVar36 = pLVar22[-1].global_alpha_info.alpha_bit_depth;
                            if (bVar36 != 0) {
                              uVar21 = 2 << (bVar36 & 0x1f);
                              uVar2 = pLVar22[-1].global_alpha_info.alpha_transparent_value;
                              if ((int)(uint)uVar2 < (int)uVar21) {
                                uVar2 = pLVar22[-1].global_alpha_info.alpha_opaque_value;
                                if (uVar2 < uVar21) {
                                  bVar14 = true;
                                  if ((pLVar22[-1].global_alpha_info.alpha_color_description.second
                                       == true) && (local_340->alpha_use_idc != ALPHA_STRAIGHT)) {
                                    parse_multilayer_file();
                                    goto LAB_00127db4;
                                  }
                                  break;
                                }
                                pcVar30 = "Error: alpha_opaque_value %d out of range [0, %d]\n";
                              }
                              else {
                                pcVar30 = "Error: alpha_transparent_value %d out of range [0, %d]\n"
                                ;
                              }
                              bVar14 = false;
                              fprintf(_stderr,pcVar30,(ulong)uVar2,(ulong)(uVar21 - 1));
                              break;
                            }
                            parse_multilayer_file();
                          }
LAB_00127db4:
                          bVar14 = false;
                          break;
                        }
                        iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                        if (iVar19 == 0) {
                          if (value_2.type_ != kInteger) {
                            if (value_2.type_ == kFloatingPoint) {
                              pcVar30 = 
                              "Floating point value found where integer was expected at line %d\n";
                            }
                            else {
                              pcVar30 = "No value found where integer was expected at line %d\n";
                            }
                            bVar14 = false;
                            fprintf(_stderr,pcVar30,(ulong)(uint)line_idx);
                            break;
                          }
                          if (7 < (ulong)value_2.int_value_) {
                            bVar14 = false;
                            fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n"
                                    ,value_2.int_value_,0,7);
                            break;
                          }
                          local_340->alpha_use_idc = (AlphaUse)value_2.int_value_;
                          goto LAB_00127b5d;
                        }
                        iVar20 = std::__cxx11::string::compare((char *)&field_name_2);
                        iVar19 = iVar17 + -0x44;
                        if (iVar20 == 0) {
LAB_00127cda:
                          bVar13 = anon_unknown_0::ParsedValue::IntegerValueInRange<bool>
                                             ((ParsedValue *)(ulong)value_2.type_,value_2.int_value_
                                              ,(ulong)(uint)line_idx,iVar19,pbVar29);
LAB_00127d06:
                          if (bVar13 == false) goto LAB_00127db4;
                          goto LAB_00127b5d;
                        }
                        iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                        if (iVar19 == 0) {
                          bVar13 = anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_char>
                                             ((ParsedValue *)(ulong)value_2.type_,value_2.int_value_
                                              ,8,0xf,(uchar *)(ulong)(uint)line_idx);
                          goto LAB_00127d06;
                        }
                        iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                        if (iVar19 == 0) {
                          bVar13 = anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_char>
                                             ((ParsedValue *)(ulong)value_2.type_,value_2.int_value_
                                              ,0,3,(uchar *)(ulong)(uint)line_idx);
                        }
                        else {
                          iVar20 = std::__cxx11::string::compare((char *)&field_name_2);
                          iVar19 = iVar17 + -0x41;
                          if (iVar20 == 0) goto LAB_00127cda;
                          iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                          if ((iVar19 != 0) &&
                             (iVar19 = std::__cxx11::string::compare((char *)&field_name_2),
                             iVar19 != 0)) {
                            iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                            if (iVar19 != 0) {
                              bVar14 = false;
                              fprintf(_stderr,"Error: Unknown field \'%s\' at line %d\n",
                                      field_name_2._M_dataplus._M_p,(ulong)(uint)line_idx);
                              break;
                            }
                            bVar13 = anon_unknown_0::parse_color_properties
                                               (&file,el._0_4_,&line_idx,
                                                (ColorProperties *)&indent_2);
                            if (!bVar13) goto LAB_00127db4;
                            pLVar4 = pLVar22 + -1;
                            (pLVar4->global_alpha_info).alpha_color_description.first.color_range =
                                 (bool)(undefined1)indent_2;
                            (pLVar4->global_alpha_info).alpha_color_description.first.
                            color_primaries = indent_2._1_1_;
                            (pLVar4->global_alpha_info).alpha_color_description.first.
                            transfer_characteristics = indent_2._2_1_;
                            (pLVar4->global_alpha_info).alpha_color_description.first.
                            matrix_coefficients = indent_2._3_1_;
                            pLVar22[-1].global_alpha_info.alpha_color_description.second = true;
                            goto LAB_00127b5d;
                          }
                          bVar13 = anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_short>
                                             ((ParsedValue *)(ulong)value_2.type_,value_2.int_value_
                                              ,0,0xffff,(unsigned_short *)(ulong)(uint)line_idx);
                        }
                        bVar14 = false;
                      } while (bVar13 != false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)field_name_2._M_dataplus._M_p != &field_name_2.field_2) {
                        operator_delete(field_name_2._M_dataplus._M_p);
                      }
                      bVar13 = true;
                      goto joined_r0x00127dd9;
                    }
                    iVar17 = std::__cxx11::string::compare((char *)&field_name_1);
                    if (iVar17 == 0) {
                      iVar17 = indent_1 + 1;
                      indent_2 = -1;
                      field_name_2._M_dataplus._M_p = (pointer)&field_name_2.field_2;
                      field_name_2._M_string_length = 0;
                      field_name_2.field_2._M_allocated_capacity =
                           field_name_2.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      value_2.type_ = kNone;
                      value_2.int_value_ = 0;
                      value_2.double_value_ = 0.0;
                      pLVar4 = pLVar22 + -1;
                      (pLVar4->global_depth_info).z_near.first.sign_flag = false;
                      (pLVar4->global_depth_info).z_near.first.exponent = '\0';
                      (pLVar4->global_depth_info).z_near.first.mantissa_len = '\0';
                      (pLVar4->global_depth_info).z_near.first.field_0x3 = 0;
                      (pLVar4->global_depth_info).z_near.first.mantissa = 0;
                      pLVar22[-1].global_depth_info.z_near.second = false;
                      pLVar4 = pLVar22 + -1;
                      (pLVar4->global_depth_info).z_far.first.sign_flag = false;
                      (pLVar4->global_depth_info).z_far.first.exponent = '\0';
                      (pLVar4->global_depth_info).z_far.first.mantissa_len = '\0';
                      (pLVar4->global_depth_info).z_far.first.field_0x3 = 0;
                      (pLVar4->global_depth_info).z_far.first.mantissa = 0;
                      pLVar22[-1].global_depth_info.z_far.second = false;
                      pLVar4 = pLVar22 + -1;
                      (pLVar4->global_depth_info).d_min.first.sign_flag = false;
                      (pLVar4->global_depth_info).d_min.first.exponent = '\0';
                      (pLVar4->global_depth_info).d_min.first.mantissa_len = '\0';
                      (pLVar4->global_depth_info).d_min.first.field_0x3 = 0;
                      (pLVar4->global_depth_info).d_min.first.mantissa = 0;
                      pLVar22[-1].global_depth_info.d_min.second = false;
                      pLVar4 = pLVar22 + -1;
                      (pLVar4->global_depth_info).d_max.first.sign_flag = false;
                      (pLVar4->global_depth_info).d_max.first.exponent = '\0';
                      (pLVar4->global_depth_info).d_max.first.mantissa_len = '\0';
                      (pLVar4->global_depth_info).d_max.first.field_0x3 = 0;
                      (pLVar4->global_depth_info).d_max.first.mantissa = 0;
                      pLVar22[-1].global_depth_info.d_max.second = false;
                      pLVar22[-1].global_depth_info.depth_representation_type = '\0';
                      pLVar22[-1].global_depth_info.disparity_ref_view_id = '\0';
                      local_340 = (AlphaInformation *)
                                  &pLVar22[-1].global_depth_info.disparity_ref_view_id;
LAB_00127732:
                      bVar15 = anon_unknown_0::parse_line
                                         (&file,iVar17,false,&indent_2,&has_list_prefix_2,&line_idx,
                                          &field_name_2,&value_2,&syntax_error_1);
                      if (!bVar15) {
                        bVar36 = syntax_error_1 ^ 1;
                        goto LAB_00127f37;
                      }
                      iVar18 = std::__cxx11::string::compare((char *)&field_name_2);
                      if (iVar18 == 0) {
                        if (value_2.type_ == kNone) {
                          parse_multilayer_file((libaom_examples *)&line_idx);
                        }
                        else {
                          dVar5 = value_2.double_value_;
                          if (value_2.type_ != kFloatingPoint) {
                            dVar5 = (double)value_2.int_value_;
                          }
                          bVar15 = double_to_depth_representation_element(dVar5,&el);
                          if (bVar15) {
                            DVar7.mantissa = el.mantissa;
                            DVar7.sign_flag = el.sign_flag;
                            DVar7.exponent = el.exponent;
                            DVar7.mantissa_len = el.mantissa_len;
                            DVar7._3_1_ = el._3_1_;
                            pLVar22[-1].global_depth_info.z_near.first = DVar7;
                            pLVar22[-1].global_depth_info.z_near.second = true;
                            goto LAB_00127732;
                          }
                        }
                      }
                      else {
                        iVar18 = std::__cxx11::string::compare((char *)&field_name_2);
                        if (iVar18 == 0) {
                          if (value_2.type_ == kNone) {
                            parse_multilayer_file((libaom_examples *)&line_idx);
                            goto LAB_00127f34;
                          }
                          dVar5 = value_2.double_value_;
                          if (value_2.type_ != kFloatingPoint) {
                            dVar5 = (double)value_2.int_value_;
                          }
                          bVar15 = double_to_depth_representation_element(dVar5,&el);
                          if (bVar15) {
                            DVar8.mantissa = el.mantissa;
                            DVar8.sign_flag = el.sign_flag;
                            DVar8.exponent = el.exponent;
                            DVar8.mantissa_len = el.mantissa_len;
                            DVar8._3_1_ = el._3_1_;
                            pLVar22[-1].global_depth_info.z_far.first = DVar8;
                            pLVar22[-1].global_depth_info.z_far.second = true;
                            goto LAB_00127732;
                          }
                        }
                        else {
                          iVar18 = std::__cxx11::string::compare((char *)&field_name_2);
                          if (iVar18 == 0) {
                            if (value_2.type_ == kNone) {
                              parse_multilayer_file((libaom_examples *)&line_idx);
                              goto LAB_00127f34;
                            }
                            dVar5 = value_2.double_value_;
                            if (value_2.type_ != kFloatingPoint) {
                              dVar5 = (double)value_2.int_value_;
                            }
                            bVar15 = double_to_depth_representation_element(dVar5,&el);
                            if (bVar15) {
                              DVar9.mantissa = el.mantissa;
                              DVar9.sign_flag = el.sign_flag;
                              DVar9.exponent = el.exponent;
                              DVar9.mantissa_len = el.mantissa_len;
                              DVar9._3_1_ = el._3_1_;
                              pLVar22[-1].global_depth_info.d_min.first = DVar9;
                              pLVar22[-1].global_depth_info.d_min.second = true;
                              goto LAB_00127732;
                            }
                          }
                          else {
                            iVar18 = std::__cxx11::string::compare((char *)&field_name_2);
                            if (iVar18 != 0) {
                              iVar18 = std::__cxx11::string::compare((char *)&field_name_2);
                              if (iVar18 == 0) {
                                iVar18 = 0xf;
                              }
                              else {
                                iVar18 = std::__cxx11::string::compare((char *)&field_name_2);
                                if (iVar18 != 0) {
                                  bVar36 = 0;
                                  fprintf(_stderr,"Error: Unknown field \'%s\' at line %d\n",
                                          field_name_2._M_dataplus._M_p,(ulong)(uint)line_idx);
                                  goto LAB_00127f37;
                                }
                                iVar18 = 3;
                              }
                              bVar36 = 0;
                              bVar15 = anon_unknown_0::ParsedValue::
                                       IntegerValueInRange<unsigned_char>
                                                 ((ParsedValue *)(ulong)value_2.type_,
                                                  value_2.int_value_,0,iVar18,
                                                  (uchar *)(ulong)(uint)line_idx);
                              if (!bVar15) goto LAB_00127f37;
                              goto LAB_00127732;
                            }
                            if (value_2.type_ == kNone) {
                              parse_multilayer_file((libaom_examples *)&line_idx);
                              goto LAB_00127f34;
                            }
                            dVar5 = value_2.double_value_;
                            if (value_2.type_ != kFloatingPoint) {
                              dVar5 = (double)value_2.int_value_;
                            }
                            bVar15 = double_to_depth_representation_element(dVar5,&el);
                            if (bVar15) {
                              DVar10.mantissa = el.mantissa;
                              DVar10.sign_flag = el.sign_flag;
                              DVar10.exponent = el.exponent;
                              DVar10.mantissa_len = el.mantissa_len;
                              DVar10._3_1_ = el._3_1_;
                              pLVar22[-1].global_depth_info.d_max.first = DVar10;
                              pLVar22[-1].global_depth_info.d_max.second = true;
                              goto LAB_00127732;
                            }
                          }
                        }
                      }
LAB_00127f34:
                      bVar36 = 0;
                      goto LAB_00127f37;
                    }
                    fprintf(_stderr,"Error: Unknown field %s at line %d\n",
                            field_name_1._M_dataplus._M_p,(ulong)(uint)line_idx);
                    goto LAB_001280a5;
                  }
                  bVar14 = anon_unknown_0::parse_color_properties
                                     (&file,indent_1,&line_idx,(ColorProperties *)&field_name_2);
                  if (!bVar14) goto LAB_001280a5;
                  pLVar22[-1].layer_color_description.first = field_name_2._M_dataplus._M_p._0_4_;
                  pLVar22[-1].layer_color_description.second = true;
                }
                goto LAB_00127433;
              }
              iVar17 = 7;
            }
            bVar14 = anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_char>
                               ((ParsedValue *)(ulong)value_1.type_,value_1.int_value_,0,iVar17,
                                (uchar *)(ulong)(uint)line_idx);
          }
joined_r0x00127dd9:
          if (!bVar14) goto LAB_001280a5;
          goto LAB_00127433;
        }
        bVar37 = 0;
        fprintf(_stderr,"Error: Unknown field %s at line %d\n",field_name._M_dataplus._M_p,
                (ulong)(uint)line_idx);
        goto LAB_00128147;
      }
      if (value.type_ != kInteger) {
        if (value.type_ == kFloatingPoint) {
          pcVar30 = "Floating point value found where integer was expected at line %d\n";
        }
        else {
          pcVar30 = "No value found where integer was expected at line %d\n";
        }
        bVar37 = 0;
        fprintf(_stderr,pcVar30,(ulong)(uint)line_idx);
        goto LAB_00128147;
      }
      if (0x3f < (ulong)value.int_value_) {
        bVar37 = 0;
        fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n",value.int_value_,0,
                0x3f);
        goto LAB_00128147;
      }
      multilayer->use_case = (MultilayerUseCase)value.int_value_;
    } while( true );
  }
  bVar13 = false;
  fprintf(_stderr,"Error: Failed to open %s\n",metadata_path);
LAB_00128301:
  std::ifstream::~ifstream(&file);
  return bVar13;
LAB_00127f37:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name_2._M_dataplus._M_p != &field_name_2.field_2) {
    operator_delete(field_name_2._M_dataplus._M_p);
  }
  if (bVar36 == 0) goto LAB_001280a5;
  if ((pLVar22[-1].global_depth_info.d_min.second == false) &&
     (bVar15 = true, pLVar22[-1].global_depth_info.d_max.second != true)) goto LAB_00127433;
  this_00 = (libaom_examples *)
            (((long)(multilayer->layers).
                    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(multilayer->layers).
                    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x70a3d70a3d70a3d7);
  bVar15 = true;
  if (this_00 + -1 == (libaom_examples *)(ulong)(byte)(char)local_340->alpha_use_idc)
  goto LAB_0012812f;
  goto LAB_00127433;
LAB_0012812f:
  parse_multilayer_file(this_00);
LAB_001280a5:
  bVar13 = false;
LAB_001280aa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
    operator_delete(field_name_1._M_dataplus._M_p);
  }
  if (!bVar13) goto LAB_00128144;
  goto LAB_0012737f;
LAB_00128144:
  bVar37 = 0;
LAB_00128147:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name._M_dataplus._M_p != &field_name.field_2) {
    operator_delete(field_name._M_dataplus._M_p);
  }
  if (bVar37 != 0) {
    pLVar22 = (multilayer->layers).
              super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar4 = (multilayer->layers).
             super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar22 != pLVar4) {
      uVar25 = ((long)pLVar4 - (long)pLVar22 >> 2) * -0x70a3d70a3d70a3d7;
      if (uVar25 < 5) {
        pLVar6 = pLVar22;
        do {
          pLVar24 = pLVar6 + 1;
          pMVar1 = &pLVar6->layer_view_type;
          if (*pMVar1 != pLVar22->layer_view_type) break;
          pLVar6 = pLVar24;
        } while (pLVar24 != pLVar4);
        bVar13 = true;
        if (0 < (int)uVar25) {
          MVar3 = multilayer->use_case;
          pbVar29 = &(pLVar22->layer_color_description).second;
          uVar35 = 0;
          do {
            if (MVar3 < (MULTILAYER_USE_CASE_444|MULTILAYER_USE_CASE_GLOBAL_DEPTH)) {
              if ((0xce6U >> (MVar3 & 0x1f) & 1) == 0) {
                uVar21 = 0x3018 >> (MVar3 & 0x1f);
joined_r0x0012820a:
                if (((uVar21 & 1) == 0) || (*pMVar1 == pLVar22->layer_view_type)) goto LAB_0012821c;
                bVar13 = false;
                fprintf(_stderr,
                        "Error: for use_case %d, all layers must have the same view type, found different view_type for layer %d (zero-based index)\n"
                        ,(ulong)MVar3,uVar35 & 0xffffffff);
              }
              else {
                uVar34 = (ulong)*(uint *)(pbVar29 + -8);
                if (*(uint *)(pbVar29 + -8) == 2) {
                  if (MULTILAYER_USE_CASE_444_GLOBAL_DEPTH < MVar3) goto LAB_0012821c;
                  uVar21 = 0xc1e >> (MVar3 & 0x1f);
                  goto joined_r0x0012820a;
                }
                pcVar30 = 
                "Error: for use_case %d, all layers must have scope %d, found %d instead for layer %d (zero-based index)\n"
                ;
                uVar26 = (ulong)MVar3;
                uVar25 = 2;
LAB_00128428:
                bVar13 = false;
                fprintf(_stderr,pcVar30,uVar26,uVar25,uVar34,uVar35 & 0xffffffff);
              }
              goto LAB_00128301;
            }
LAB_0012821c:
            uVar21 = *(uint *)(pbVar29 + -0x18);
            if (uVar21 != 0) {
              switch(MVar3) {
              case MULTILAYER_USE_CASE_GLOBAL_ALPHA:
              case MULTILAYER_USE_CASE_ALPHA:
              case MULTILAYER_USE_CASE_STEREO_GLOBAL_ALPHA:
              case MULTILAYER_USE_CASE_STEREO_ALPHA:
                if ((uVar21 | 4) != 5) {
                  uVar27 = 5;
LAB_001284a3:
                  uVar25 = (ulong)MVar3;
                  pcVar30 = 
                  "Error: for use_case %d, all layers must be of type %d or %d, found %d for layer %d (zero-based index)\n"
                  ;
                  uVar31 = 1;
                  uVar34 = (ulong)uVar21;
LAB_001284aa:
                  bVar13 = false;
                  fprintf(_stderr,pcVar30,uVar25,uVar31,uVar27,uVar34,uVar35);
                  goto LAB_00128301;
                }
                break;
              case MULTILAYER_USE_CASE_GLOBAL_DEPTH:
              case MULTILAYER_USE_CASE_DEPTH:
              case MULTILAYER_USE_CASE_STEREO_GLOBAL_DEPTH:
              case MULTILAYER_USE_CASE_STEREO_DEPTH:
                if ((uVar21 != 1) && (uVar21 != 6)) {
                  uVar27 = 6;
                  goto LAB_001284a3;
                }
                break;
              case MULTILAYER_USE_CASE_STEREO:
                if (uVar21 != 1) {
                  pcVar30 = 
                  "Error: for use_case %d, all layers must be of type %d, found %d for layer %d (zero-based index)\n"
                  ;
                  uVar26 = 5;
                  uVar25 = 1;
                  uVar34 = (ulong)uVar21;
                  goto LAB_00128428;
                }
                break;
              case MULTILAYER_USE_CASE_444_GLOBAL_ALPHA:
                if (3 < uVar21 - 2) {
                  uVar27 = 10;
                  uVar31 = 2;
                  uVar32 = 3;
                  uVar33 = 4;
                  uVar38 = 5;
LAB_001285b7:
                  bVar13 = false;
                  fprintf(_stderr,
                          "Error: for use_case %d, all layers must be of type %d, %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                          ,uVar27,uVar31,uVar32,uVar33,uVar38,(ulong)uVar21,uVar35);
                  goto LAB_00128301;
                }
                break;
              case MULTILAYER_USE_CASE_444_GLOBAL_DEPTH:
                if ((2 < uVar21 - 2) && (uVar21 != 6)) {
                  uVar27 = 0xb;
                  uVar31 = 2;
                  uVar32 = 3;
                  uVar33 = 4;
                  uVar38 = 6;
                  goto LAB_001285b7;
                }
                break;
              case MULTILAYER_USE_CASE_444:
                if (2 < uVar21 - 2) {
                  pcVar30 = 
                  "Error: for use_case %d, all layers must be of type %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                  ;
                  uVar25 = 0xc;
                  uVar31 = 2;
                  uVar27 = 3;
                  uVar34 = 4;
                  uVar35 = (ulong)uVar21;
                  goto LAB_001284aa;
                }
                break;
              case MULTILAYER_USE_CASE_420_444:
                if (4 < uVar21) {
                  uVar27 = 0xd;
                  uVar31 = 1;
                  uVar32 = 2;
                  uVar33 = 3;
                  uVar38 = 4;
                  goto LAB_001285b7;
                }
              }
            }
            uVar34 = (ulong)pbVar29[-0xb];
            iVar16 = 1 << ((byte)uVar35 & 0x1f);
            if (iVar16 <= (int)(uint)pbVar29[-0xb]) {
              pcVar30 = 
              "Error: layer_dependency_idc of layer %d (zero-based index) must be in [0, %d], found %d for layer %d (zero-based index)\n"
              ;
              uVar26 = uVar35 & 0xffffffff;
              uVar25 = (ulong)(iVar16 - 1);
              goto LAB_00128428;
            }
            if ((uVar21 - 5 < 2) && (*pbVar29 == true)) {
              pcVar30 = 
              "Error: alpha or depth layers cannot have layer_color_description for layer %d (zero-based index)\n"
              ;
              uVar25 = uVar35 & 0xffffffff;
              goto LAB_0012844d;
            }
            uVar35 = uVar35 + 1;
            pbVar29 = pbVar29 + 100;
          } while (uVar25 - uVar35 != 0);
          bVar13 = true;
        }
      }
      else {
        pcVar30 = "Error: Too many layers, found %d, max 4\n";
LAB_0012844d:
        bVar13 = false;
        fprintf(_stderr,pcVar30,uVar25);
      }
      goto LAB_00128301;
    }
    parse_multilayer_file();
  }
  bVar13 = false;
  goto LAB_00128301;
}

Assistant:

bool parse_multilayer_file(const char *metadata_path,
                           MultilayerMetadata *multilayer) {
  std::ifstream file(metadata_path);
  if (!file.is_open()) {
    fprintf(stderr, "Error: Failed to open %s\n", metadata_path);
    return false;
  }

  if (!parse_multilayer_metadata(file, multilayer) ||
      !validate_multilayer_metadata(*multilayer)) {
    return false;
  }
  return multilayer;
}